

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10InvalidMappingFromanyPolicyTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section10InvalidMappingFromanyPolicyTest7
          (Section10InvalidMappingFromanyPolicyTest7<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10InvalidMappingFromanyPolicyTest7) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "MappingFromanyPolicyCACert",
                               "InvalidMappingFromanyPolicyTest7EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "MappingFromanyPolicyCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.7";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}